

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O0

void __thiscall facenet::Reduction_A(facenet *this,pBox *input,pBox *output)

{
  pBox *this_00;
  pBox *this_01;
  pBox *this_02;
  pBox *this_03;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  pBox *this_04;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  mydataFmt *pmVar1;
  string local_278;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string filename;
  mydataFmt *pointTeam [16];
  long dataNumber [16];
  long conv4;
  long conv3;
  long conv2;
  long conv1;
  BN *conv4_beta;
  BN *conv4_mean;
  BN *conv4_var;
  BN *conv3_beta;
  BN *conv3_mean;
  BN *conv3_var;
  BN *conv2_beta;
  BN *conv2_mean;
  BN *conv2_var;
  BN *conv1_beta;
  BN *conv1_mean;
  BN *conv1_var;
  pBox *pooling1_out;
  Weight *conv4_wb;
  Weight *conv3_wb;
  Weight *conv2_wb;
  Weight *conv1_wb;
  pBox *conv4_out;
  pBox *conv3_out;
  pBox *conv2_out;
  pBox *conv1_out;
  pBox *output_local;
  pBox *input_local;
  facenet *this_local;
  
  this_00 = (pBox *)operator_new(0x38);
  pBox::pBox(this_00);
  this_01 = (pBox *)operator_new(0x38);
  pBox::pBox(this_01);
  this_02 = (pBox *)operator_new(0x38);
  pBox::pBox(this_02);
  this_03 = (pBox *)operator_new(0x38);
  pBox::pBox(this_03);
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  this_04 = (pBox *)operator_new(0x38);
  pBox::pBox(this_04);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  pmVar1 = (mydataFmt *)ConvAndFcInit(weight,0x180,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0x180);
  ConvAndFcInit(weight_00,0xc0,0x100,1,1,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0xc0);
  ConvAndFcInit(weight_01,0xc0,0xc0,3,1,0,0,0,0,0);
  BatchNormInit(beta_01,mean_01,var_01,0xc0);
  ConvAndFcInit(weight_02,0x100,0xc0,3,2,0,0,0,0,0);
  BatchNormInit(beta_02,mean_02,var_02,0x100);
  filename.field_2._8_8_ = weight->pdata;
  pointTeam[0] = beta->pdata;
  pointTeam[1] = mean->pdata;
  pointTeam[2] = var->pdata;
  pointTeam[3] = weight_00->pdata;
  pointTeam[4] = beta_00->pdata;
  pointTeam[5] = mean_00->pdata;
  pointTeam[6] = var_00->pdata;
  pointTeam[7] = weight_01->pdata;
  pointTeam[8] = beta_01->pdata;
  pointTeam[9] = mean_01->pdata;
  pointTeam[10] = var_01->pdata;
  pointTeam[0xb] = weight_02->pdata;
  pointTeam[0xc] = beta_02->pdata;
  pointTeam[0xd] = mean_02->pdata;
  pointTeam[0xe] = var_02->pdata;
  pointTeam[0xf] = pmVar1;
  std::__cxx11::to_string(&local_248,0x80);
  std::operator+(&local_228,"../model_",&local_248);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &local_228,"/Mixed_6a_list.txt");
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string((string *)&local_278,(string *)local_208);
  readData(&local_278,(long *)(pointTeam + 0xf),(mydataFmt **)((long)&filename.field_2 + 8),0x10);
  std::__cxx11::string::~string((string *)&local_278);
  maxPoolingInit(input,this_04,3,2,0);
  maxPooling(input,this_04,3,2);
  convolutionInit(weight,input,this_00);
  convolution(weight,input,this_00);
  BatchNorm(this_00,beta,mean,var);
  relu(this_00,weight->pbias);
  convolutionInit(weight_00,input,this_01);
  convolution(weight_00,input,this_01);
  BatchNorm(this_01,beta_00,mean_00,var_00);
  relu(this_01,weight_00->pbias);
  convolutionInit(weight_01,this_01,this_02);
  convolution(weight_01,this_01,this_02);
  BatchNorm(this_02,beta_01,mean_01,var_01);
  relu(this_02,weight_01->pbias);
  convolutionInit(weight_02,this_02,this_03);
  convolution(weight_02,this_02,this_03);
  BatchNorm(this_03,beta_02,mean_02,var_02);
  relu(this_03,weight_02->pbias);
  conv_mergeInit(output,this_04,this_00,this_03,(pBox *)0x0);
  conv_merge(output,this_04,this_00,this_03,(pBox *)0x0);
  freepBox(this_00);
  freepBox(this_01);
  freepBox(this_02);
  freepBox(this_03);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freepBox(this_04);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  std::__cxx11::string::~string((string *)local_208);
  return;
}

Assistant:

void facenet::Reduction_A(pBox *input, pBox *output) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;

    struct pBox *pooling1_out = new pBox;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 384, 256, 3, 2, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 384);

    long conv2 = ConvAndFcInit(conv2_wb, 192, 256, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 192);
    long conv3 = ConvAndFcInit(conv3_wb, 192, 192, 3, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 192);
    long conv4 = ConvAndFcInit(conv4_wb, 256, 192, 3, 2, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 256);
    long dataNumber[16] = {conv1, 384, 384, 384, conv2, 192, 192, 192, conv3, 192, 192, 192, conv4, 256, 256, 256};

//    mydataFmt *pointTeam[16] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata};
    mydataFmt *pointTeam[16] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata};
    string filename = "../model_" + to_string(Num) + "/Mixed_6a_list.txt";
    readData(filename, dataNumber, pointTeam, 16);

    maxPoolingInit(input, pooling1_out, 3, 2);
    // 17*17*256
    maxPooling(input, pooling1_out, 3, 2);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 17 x 17 x 384
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 35 x 35 x 192
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 35 x 35 x 192
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 17 x 17 x 256
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);
    conv_mergeInit(output, pooling1_out, conv1_out, conv4_out);
    //17×17×896
    conv_merge(output, pooling1_out, conv1_out, conv4_out);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);

    freepBox(pooling1_out);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
}